

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void ctx_modules_undo_backlinks(ly_ctx *ctx,ly_set *mods)

{
  lys_module *plVar1;
  int iVar2;
  lys_node *node;
  long lVar3;
  ly_set *plVar4;
  lys_node *plVar5;
  lys_node *set;
  uint index;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  lVar3 = 4;
  do {
    if ((ctx->models).used <= lVar3) {
      return;
    }
    plVar1 = (ctx->models).list[lVar3];
    for (uVar6 = 0; uVar6 < plVar1->features_size; uVar6 = uVar6 + 1) {
      plVar4 = plVar1->features[uVar6].depfeatures;
      if (plVar4 != (ly_set *)0x0) {
        uVar8 = 0;
        while( true ) {
          uVar7 = (uint)uVar8;
          if (plVar4->number <= uVar7) break;
          if (mods == (ly_set *)0x0) {
LAB_00110838:
            ly_set_rm_index(plVar4,uVar7);
            uVar7 = uVar7 - 1;
          }
          else {
            iVar2 = ly_set_contains(mods,(plVar4->set).s[uVar8]->module);
            if (iVar2 != -1) {
              plVar4 = plVar1->features[uVar6].depfeatures;
              goto LAB_00110838;
            }
          }
          uVar8 = (ulong)(uVar7 + 1);
          plVar4 = plVar1->features[uVar6].depfeatures;
        }
        if (plVar4->number == 0) {
          ly_set_free(plVar4);
          plVar1->features[uVar6].depfeatures = (ly_set *)0x0;
        }
      }
    }
    for (uVar6 = 0; uVar6 < plVar1->ident_size; uVar6 = uVar6 + 1) {
      plVar4 = plVar1->ident[uVar6].der;
      if (plVar4 != (ly_set *)0x0) {
        uVar8 = 0;
        while( true ) {
          uVar7 = (uint)uVar8;
          if (plVar4->number <= uVar7) break;
          if (mods == (ly_set *)0x0) {
LAB_001108c5:
            ly_set_rm_index(plVar4,uVar7);
            uVar7 = uVar7 - 1;
          }
          else {
            iVar2 = ly_set_contains(mods,(plVar4->set).s[uVar8]->module);
            if (iVar2 != -1) {
              plVar4 = plVar1->ident[uVar6].der;
              goto LAB_001108c5;
            }
          }
          uVar8 = (ulong)(uVar7 + 1);
          plVar4 = plVar1->ident[uVar6].der;
        }
        if (plVar4->number == 0) {
          ly_set_free(plVar4);
          plVar1->ident[uVar6].der = (ly_set *)0x0;
        }
      }
    }
    plVar5 = plVar1->data;
    while (plVar5 != (lys_node *)0x0) {
      set = plVar5->child;
      if ((plVar5->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
        if (set != (lys_node *)0x0) {
          if (mods != (ly_set *)0x0) {
            uVar6 = 0;
            while( true ) {
              uVar7 = *(uint *)((long)&set->name + 4);
              index = (uint)uVar6;
              if (uVar7 <= index) break;
              iVar2 = ly_set_contains(mods,*(void **)(*(long *)(set->dsc + uVar6 * 8) + 0x30));
              if (iVar2 != -1) {
                ly_set_rm_index((ly_set *)plVar5->child,index);
                index = index - 1;
              }
              uVar6 = (ulong)(index + 1);
              set = plVar5->child;
            }
            if (uVar7 != 0) goto LAB_00110980;
          }
          ly_set_free((ly_set *)set);
          plVar5->child = (lys_node *)0x0;
        }
        set = (lys_node *)0x0;
      }
LAB_00110980:
      node = plVar5;
      if (set != (lys_node *)0x0 && (plVar5->nodetype & 0x882c) == LYS_UNKNOWN) goto LAB_0011099d;
      do {
        set = node->next;
LAB_0011099d:
        plVar5 = set;
      } while ((set == (lys_node *)0x0) && (node = lys_parent(node), node != (lys_node *)0x0));
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static void
ctx_modules_undo_backlinks(struct ly_ctx *ctx, struct ly_set *mods)
{
    int o;
    uint8_t j;
    unsigned int u, v;
    struct lys_module *mod;
    struct lys_node *elem, *next;
    struct lys_node_leaf *leaf;

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    for (o = INTERNAL_MODULES_COUNT - 1; o < ctx->models.used; o++) {
        mod = ctx->models.list[o]; /* shortcut */

        /* 1) features */
        for (j = 0; j < mod->features_size; j++) {
            if (!mod->features[j].depfeatures) {
                continue;
            }
            for (v = 0; v < mod->features[j].depfeatures->number; v++) {
                if (!mods || ly_set_contains(mods, ((struct lys_feature *)mod->features[j].depfeatures->set.g[v])->module) != -1) {
                    /* depending feature is in module to remove */
                    ly_set_rm_index(mod->features[j].depfeatures, v);
                    v--;
                }
            }
            if (!mod->features[j].depfeatures->number) {
                /* all backlinks removed */
                ly_set_free(mod->features[j].depfeatures);
                mod->features[j].depfeatures = NULL;
            }
        }

        /* 2) identities */
        for (u = 0; u < mod->ident_size; u++) {
            if (!mod->ident[u].der) {
                continue;
            }
            for (v = 0; v < mod->ident[u].der->number; v++) {
                if (!mods || ly_set_contains(mods, ((struct lys_ident *)mod->ident[u].der->set.g[v])->module) != -1) {
                    /* derived identity is in module to remove */
                    ly_set_rm_index(mod->ident[u].der, v);
                    v--;
                }
            }
            if (!mod->ident[u].der->number) {
                /* all backlinks removed */
                ly_set_free(mod->ident[u].der);
                mod->ident[u].der = NULL;
            }
        }

        /* 3) leafrefs */
        for (elem = next = mod->data; elem; elem = next) {
            if (elem->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                leaf = (struct lys_node_leaf *)elem; /* shortcut */
                if (leaf->backlinks) {
                    if (!mods) {
                        /* remove all backlinks */
                        ly_set_free(leaf->backlinks);
                        leaf->backlinks = NULL;
                    } else {
                        for (v = 0; v < leaf->backlinks->number; v++) {
                            if (ly_set_contains(mods, leaf->backlinks->set.s[v]->module) != -1) {
                                /* derived identity is in module to remove */
                                ly_set_rm_index(leaf->backlinks, v);
                                v--;
                            }
                        }
                        if (!leaf->backlinks->number) {
                            /* all backlinks removed */
                            ly_set_free(leaf->backlinks);
                            leaf->backlinks = NULL;
                        }
                    }
                }
            }

            /* select next element to process */
            next = elem->child;
            /* child exception for leafs, leaflists, anyxml and groupings */
            if (elem->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA | LYS_GROUPING)) {
                next = NULL;
            }
            if (!next) {
                /* no children,  try siblings */
                next = elem->next;
            }
            while (!next) {
                /* parent is already processed, go to its sibling */
                elem = lys_parent(elem);
                if (!elem) {
                    /* we are done, no next element to process */
                    break;
                }
                /* no siblings, go back through parents */
                next = elem->next;
            }
        }
    }
}